

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::InitCustomTargets(cmQtAutoGenInitializer *this)

{
  ConfigString *pCVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argsOut;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  cmMakefile *pcVar2;
  cmGeneratorTarget *pcVar3;
  size_type sVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  PolicyStatus PVar9;
  uint uVar10;
  string *psVar11;
  cmState *pcVar12;
  cmValue cVar13;
  string *psVar14;
  iterator __first;
  char *extraout_RDX;
  ulong uVar15;
  size_t ii;
  long lVar16;
  long lVar17;
  string *depName;
  _Alloc_hider name;
  string_view value;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view suffix;
  string_view suffix_00;
  string def;
  string cbd;
  unsigned_long iVerb;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filterList;
  string relativeBuildDir;
  
  iVar7 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x26])();
  this->MultiConfig = SUB41(iVar7,0);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&def,this->Makefile);
  std::__cxx11::string::operator=((string *)&this->ConfigDefault,(string *)&def);
  std::__cxx11::string::~string((string *)&def);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&def,this->Makefile,IncludeEmptyConfig);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->ConfigsList,&def);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&def);
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iVerb,"CMAKE_AUTOGEN_VERBOSE",(allocator<char> *)&relativeBuildDir);
  psVar11 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&iVerb);
  std::__cxx11::string::string((string *)&def,(string *)psVar11);
  std::__cxx11::string::~string((string *)&iVerb);
  if (def._M_string_length != 0) {
    iVerb = 0;
    bVar5 = cmStrToULong(&def,&iVerb);
    if (bVar5) {
      uVar8 = (uint)iVerb;
    }
    else {
      value._M_str = extraout_RDX;
      value._M_len = (size_t)def._M_dataplus._M_p;
      bVar5 = cmValue::IsOn((cmValue *)def._M_string_length,value);
      if (!bVar5) goto LAB_0025cc4b;
      uVar8 = 1;
    }
    this->Verbosity = uVar8;
  }
LAB_0025cc4b:
  std::__cxx11::string::~string((string *)&def);
  pcVar12 = cmMakefile::GetState(this->Makefile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&def,"AUTOMOC_TARGETS_FOLDER",(allocator<char> *)&iVerb);
  cVar13 = cmState::GetGlobalProperty(pcVar12,&def);
  std::__cxx11::string::~string((string *)&def);
  if (cVar13.Value == (string *)0x0) {
    pcVar12 = cmMakefile::GetState(this->Makefile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&def,"AUTOGEN_TARGETS_FOLDER",(allocator<char> *)&iVerb);
    cVar13 = cmState::GetGlobalProperty(pcVar12,&def);
    std::__cxx11::string::~string((string *)&def);
    if (cVar13.Value != (string *)0x0) goto LAB_0025cd10;
    pcVar3 = this->GenTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&def,"FOLDER",(allocator<char> *)&iVerb);
    cVar13 = cmGeneratorTarget::GetProperty(pcVar3,&def);
    std::__cxx11::string::~string((string *)&def);
    if (cVar13.Value != (string *)0x0) goto LAB_0025cd10;
  }
  else {
LAB_0025cd10:
    std::__cxx11::string::_M_assign((string *)&this->TargetsFolder);
  }
  PVar9 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0071,false);
  if (PVar9 - NEW < 3) {
    this->CMP0071Accept = true;
  }
  else if (PVar9 == WARN) {
    this->CMP0071Warn = true;
  }
  PVar9 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0100,false);
  if (PVar9 - NEW < 3) {
    this->CMP0100Accept = true;
  }
  else if (PVar9 == WARN) {
    this->CMP0100Warn = true;
  }
  relativeBuildDir._M_dataplus._M_p = (pointer)&relativeBuildDir.field_2;
  relativeBuildDir._M_string_length = 0;
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  relativeBuildDir.field_2._M_local_buf[0] = '\0';
  def.field_2._M_local_buf[0] = '\0';
  psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
  cmsys::SystemTools::CollapseFullPath(&cbd,&def,psVar11);
  std::__cxx11::string::~string((string *)&def);
  def._M_dataplus._M_p = (pointer)cbd._M_string_length;
  def._M_string_length = (size_type)cbd._M_dataplus._M_p;
  iVerb = 0xc;
  local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x64a319;
  psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  cmStrCat<std::__cxx11::string,char[13]>
            ((string *)&filterList,(cmAlphaNum *)&def,(cmAlphaNum *)&iVerb,psVar11,
             (char (*) [13])"_autogen.dir");
  std::__cxx11::string::operator=((string *)&this->Dir,(string *)&filterList);
  std::__cxx11::string::~string((string *)&filterList);
  cmsys::SystemTools::ConvertToUnixSlashes(&(this->Dir).Info);
  pcVar3 = this->GenTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&def,"AUTOGEN_BUILD_DIR",(allocator<char> *)&iVerb);
  cmGeneratorTarget::GetSafeProperty(pcVar3,&def);
  psVar11 = &(this->Dir).Build;
  std::__cxx11::string::_M_assign((string *)psVar11);
  std::__cxx11::string::~string((string *)&def);
  if ((this->Dir).Build._M_string_length == 0) {
    def._M_dataplus._M_p = (pointer)cbd._M_string_length;
    def._M_string_length = (size_type)cbd._M_dataplus._M_p;
    local_b0 = local_a8;
    iVerb = 1;
    local_a8[0]._M_local_buf[0] = '/';
    psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
    cmStrCat<std::__cxx11::string,char[9]>
              ((string *)&filterList,(cmAlphaNum *)&def,(cmAlphaNum *)&iVerb,psVar14,
               (char (*) [9])0x61e148);
    std::__cxx11::string::operator=((string *)psVar11,(string *)&filterList);
    std::__cxx11::string::~string((string *)&filterList);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(psVar11);
  cmSystemTools::RelativePath(&def,&cbd,psVar11);
  std::__cxx11::string::operator=((string *)&(this->Dir).RelativeBuild,(string *)&def);
  std::__cxx11::string::~string((string *)&def);
  AddCleanFile(this,psVar11);
  psVar11 = &(this->Dir).Work;
  std::__cxx11::string::_M_assign((string *)psVar11);
  cmsys::SystemTools::ConvertToUnixSlashes(psVar11);
  def._M_string_length = (size_type)(this->Dir).Build._M_dataplus._M_p;
  def._M_dataplus._M_p = (pointer)(this->Dir).Build._M_string_length;
  iVerb = 8;
  local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x61648c;
  cmStrCat<>((string *)&filterList,(cmAlphaNum *)&def,(cmAlphaNum *)&iVerb);
  psVar11 = &(this->Dir).IncludeGenExp;
  prefix_01._M_str =
       (char *)filterList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  prefix_01._M_len =
       (size_t)filterList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  ConfigFileNamesAndGenex
            (this,&(this->Dir).Include,psVar11,prefix_01,(string_view)(ZEXT816(0x67e599) << 0x40));
  std::__cxx11::string::~string((string *)&filterList);
  std::__cxx11::string::~string((string *)&cbd);
  bVar5 = (this->Moc).super_GenVarsT.Enabled;
  bVar6 = (this->Uic).super_GenVarsT.Enabled;
  if (((bVar5 | bVar6) & 1) == 0) {
LAB_0025d65c:
    if ((this->Rcc).super_GenVarsT.Enabled == true) {
      bVar5 = InitRcc(this);
      if (!bVar5) goto LAB_0025d6e0;
    }
    if ((((this->Moc).super_GenVarsT.Enabled != false) ||
        (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) ||
       (((this->Rcc).super_GenVarsT.Enabled == true && (this->MultiConfig == true)))) {
      cmGeneratorTarget::AddIncludeDirectory(this->GenTarget,psVar11,true);
    }
    bVar5 = InitScanFiles(this);
    if (bVar5) {
      if (((this->Moc).super_GenVarsT.Enabled != false) ||
         (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
        InitAutogenTarget(this);
      }
      bVar5 = true;
      if ((this->Rcc).super_GenVarsT.Enabled == true) {
        InitRccTargets(this);
      }
      goto LAB_0025d6e2;
    }
  }
  else {
    if (bVar5 == false) {
LAB_0025d028:
      if ((bVar6 & 1) != 0) {
        bVar5 = InitUic(this);
        if (!bVar5) goto LAB_0025d6e0;
      }
      psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      def._M_string_length = (size_type)(psVar14->_M_dataplus)._M_p;
      def._M_dataplus._M_p = (pointer)psVar14->_M_string_length;
      iVerb = 8;
      local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x61e148;
      cmStrCat<>(&cbd,(cmAlphaNum *)&def,(cmAlphaNum *)&iVerb);
      std::__cxx11::string::operator=((string *)&this->AutogenTarget,(string *)&cbd);
      std::__cxx11::string::~string((string *)&cbd);
      pcVar3 = this->GenTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&def,"AUTOGEN_PARALLEL",(allocator<char> *)&iVerb);
      psVar14 = cmGeneratorTarget::GetSafeProperty(pcVar3,&def);
      std::__cxx11::string::~string((string *)&def);
      if (psVar14->_M_string_length == 0) {
LAB_0025d0e3:
        uVar8 = (anonymous_namespace)::GetParallelCPUCount()::count;
        if ((anonymous_namespace)::GetParallelCPUCount()::count == 0) {
          cmsys::SystemInformation::SystemInformation((SystemInformation *)&def);
          cmsys::SystemInformation::RunCPUCheck((SystemInformation *)&def);
          uVar10 = cmsys::SystemInformation::GetNumberOfPhysicalCPU((SystemInformation *)&def);
          uVar8 = 0x40;
          if (uVar10 < 0x41) {
            uVar8 = uVar10;
          }
          (anonymous_namespace)::GetParallelCPUCount()::count = 1;
          if (uVar10 != 0) {
            (anonymous_namespace)::GetParallelCPUCount()::count = uVar8;
          }
          cmsys::SystemInformation::~SystemInformation((SystemInformation *)&def);
          uVar8 = (anonymous_namespace)::GetParallelCPUCount()::count;
        }
      }
      else {
        bVar5 = std::operator==(psVar14,"AUTO");
        if (bVar5) goto LAB_0025d0e3;
        uVar8 = 1;
      }
      (this->AutogenTarget).Parallel = uVar8;
      def._M_string_length = (size_type)(this->Dir).Info._M_dataplus._M_p;
      def._M_dataplus._M_p = (pointer)(this->Dir).Info._M_string_length;
      iVerb = 0x11;
      local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x61dc3e;
      cmStrCat<>(&cbd,(cmAlphaNum *)&def,(cmAlphaNum *)&iVerb);
      std::__cxx11::string::operator=((string *)&(this->AutogenTarget).InfoFile,(string *)&cbd);
      std::__cxx11::string::~string((string *)&cbd);
      def._M_string_length = (size_type)(this->Dir).Info._M_dataplus._M_p;
      def._M_dataplus._M_p = (pointer)(this->Dir).Info._M_string_length;
      iVerb = 0xc;
      local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x61dc50;
      cmStrCat<>(&cbd,(cmAlphaNum *)&def,(cmAlphaNum *)&iVerb);
      pCVar1 = &(this->AutogenTarget).SettingsFile;
      prefix._M_str = cbd._M_dataplus._M_p;
      prefix._M_len = cbd._M_string_length;
      suffix._M_str = ".txt";
      suffix._M_len = 4;
      ConfigFileNames(this,pCVar1,prefix,suffix);
      std::__cxx11::string::~string((string *)&cbd);
      ConfigFileClean(this,pCVar1);
      def._M_string_length = (size_type)(this->Dir).Info._M_dataplus._M_p;
      def._M_dataplus._M_p = (pointer)(this->Dir).Info._M_string_length;
      iVerb = 0xb;
      local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x61dc5d;
      cmStrCat<>(&cbd,(cmAlphaNum *)&def,(cmAlphaNum *)&iVerb);
      pCVar1 = &(this->AutogenTarget).ParseCacheFile;
      prefix_00._M_str = cbd._M_dataplus._M_p;
      prefix_00._M_len = cbd._M_string_length;
      suffix_00._M_str = ".txt";
      suffix_00._M_len = 4;
      ConfigFileNames(this,pCVar1,prefix_00,suffix_00);
      std::__cxx11::string::~string((string *)&cbd);
      ConfigFileClean(this,pCVar1);
      pcVar3 = this->GenTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&def,"AUTOGEN_ORIGIN_DEPENDS",(allocator<char> *)&iVerb);
      bVar5 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&def);
      (this->AutogenTarget).DependOrigin = bVar5;
      std::__cxx11::string::~string((string *)&def);
      pcVar3 = this->GenTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&def,"AUTOGEN_TARGET_DEPENDS",(allocator<char> *)&iVerb);
      psVar14 = cmGeneratorTarget::GetSafeProperty(pcVar3,&def);
      std::__cxx11::string::~string((string *)&def);
      if (psVar14->_M_string_length != 0) {
        arg._M_str = (psVar14->_M_dataplus)._M_p;
        arg._M_len = psVar14->_M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&def,arg,false);
        sVar4 = def._M_string_length;
        for (name = def._M_dataplus; name._M_p != (pointer)sVar4; name._M_p = name._M_p + 0x20) {
          iVerb = (unsigned_long)
                  cmMakefile::FindTargetToUse(this->Makefile,(string *)name._M_p,false);
          if ((cmTarget *)iVerb == (cmTarget *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&(this->AutogenTarget).DependFiles,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       name._M_p);
          }
          else {
            std::
            _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
            ::_M_insert_unique<cmTarget*const&>
                      ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                        *)&(this->AutogenTarget).DependTargets,(cmTarget **)&iVerb);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&def);
      }
      if ((this->Moc).super_GenVarsT.Enabled == true) {
        pcVar3 = this->GenTarget;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&def,"AUTOMOC_PATH_PREFIX",(allocator<char> *)&iVerb);
        cmGeneratorTarget::GetProperty(pcVar3,&def);
        bVar5 = cmIsOn((cmValue)0x25d3bc);
        std::__cxx11::string::~string((string *)&def);
        if (bVar5) {
          (this->Moc).PathPrefix = true;
        }
        pcVar2 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&def,"CMAKE_AUTOMOC_RELAXED_MODE",(allocator<char> *)&iVerb);
        bVar5 = cmMakefile::IsOn(pcVar2,&def);
        std::__cxx11::string::~string((string *)&def);
        if (bVar5) {
          (this->Moc).RelaxedMode = true;
          pcVar2 = this->Makefile;
          def._M_dataplus._M_p = (pointer)0x85;
          def._M_string_length = (size_type)anon_var_dwarf_879f4d;
          psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
          local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(psVar14->_M_dataplus)._M_p;
          iVerb = psVar14->_M_string_length;
          cmStrCat<char[18]>(&cbd,(cmAlphaNum *)&def,(cmAlphaNum *)&iVerb,
                             (char (*) [18])" to regular mode.");
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&cbd);
          std::__cxx11::string::~string((string *)&cbd);
        }
        pcVar3 = this->GenTarget;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&def,"AUTOMOC_MOC_OPTIONS",(allocator<char> *)&iVerb);
        psVar14 = cmGeneratorTarget::GetSafeProperty(pcVar3,&def);
        arg_01._M_str = (psVar14->_M_dataplus)._M_p;
        arg_01._M_len = psVar14->_M_string_length;
        cmExpandList(arg_01,&(this->Moc).Options,false);
        std::__cxx11::string::~string((string *)&def);
        pcVar3 = this->GenTarget;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&def,"AUTOMOC_MACRO_NAMES",(allocator<char> *)&iVerb);
        psVar14 = cmGeneratorTarget::GetSafeProperty(pcVar3,&def);
        argsOut = &(this->Moc).MacroNames;
        arg_02._M_str = (psVar14->_M_dataplus)._M_p;
        arg_02._M_len = psVar14->_M_string_length;
        cmExpandList(arg_02,argsOut,false);
        std::__cxx11::string::~string((string *)&def);
        __first = cmRemoveDuplicates<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (argsOut);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(argsOut,(const_iterator)__first._M_current,
                (this->Moc).MacroNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
        pcVar3 = this->GenTarget;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&def,"AUTOMOC_DEPEND_FILTERS",(allocator<char> *)&iVerb);
        psVar14 = cmGeneratorTarget::GetSafeProperty(pcVar3,&def);
        arg_00._M_str = (psVar14->_M_dataplus)._M_p;
        arg_00._M_len = psVar14->_M_string_length;
        cmExpandedList_abi_cxx11_(&filterList,arg_00,false);
        std::__cxx11::string::~string((string *)&def);
        uVar15 = (long)filterList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)filterList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((uVar15 & 0x20) == 0) {
          this_00 = &(this->Moc).DependFilters;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::reserve(this_00,((ulong)((long)uVar15 >> 5) >> 1) + 1);
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<char_const(&)[18],char_const(&)[57]>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)this_00,(char (*) [18])"Q_PLUGIN_METADATA",
                     (char (*) [57])
                     "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\([^\\)]*FILE[ \t]*\"([^\"]+)\"");
          lVar17 = 0;
          for (lVar16 = 0;
              lVar16 != (long)filterList.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)filterList.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5; lVar16 = lVar16 + 2) {
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::emplace_back<std::__cxx11::string&,std::__cxx11::string&>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)this_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((filterList.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar17),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&filterList.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                               + lVar17));
            lVar17 = lVar17 + 0x40;
          }
        }
        else {
          def._M_dataplus._M_p = (pointer)0x2d;
          def._M_string_length = (size_type)anon_var_dwarf_879f97;
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&iVerb,(long)uVar15 >> 5);
          cmStrCat<char[25]>(&cbd,(cmAlphaNum *)&def,(cmAlphaNum *)&iVerb,
                             (char (*) [25])" is not a multiple of 2.");
          cmSystemTools::Error(&cbd);
          std::__cxx11::string::~string((string *)&cbd);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&filterList);
        if ((uVar15 & 0x20) != 0) goto LAB_0025d6e0;
      }
      goto LAB_0025d65c;
    }
    bVar5 = InitMoc(this);
    if (bVar5) {
      bVar6 = (this->Uic).super_GenVarsT.Enabled;
      goto LAB_0025d028;
    }
  }
LAB_0025d6e0:
  bVar5 = false;
LAB_0025d6e2:
  std::__cxx11::string::~string((string *)&relativeBuildDir);
  return bVar5;
}

Assistant:

bool cmQtAutoGenInitializer::InitCustomTargets()
{
  // Configurations
  this->MultiConfig = this->GlobalGen->IsMultiConfig();
  this->ConfigDefault = this->Makefile->GetDefaultConfiguration();
  this->ConfigsList =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  // Verbosity
  {
    std::string def =
      this->Makefile->GetSafeDefinition("CMAKE_AUTOGEN_VERBOSE");
    if (!def.empty()) {
      unsigned long iVerb = 0;
      if (cmStrToULong(def, &iVerb)) {
        // Numeric verbosity
        this->Verbosity = static_cast<unsigned int>(iVerb);
      } else {
        // Non numeric verbosity
        if (cmIsOn(def)) {
          this->Verbosity = 1;
        }
      }
    }
  }

  // Targets FOLDER
  {
    cmValue folder =
      this->Makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!folder) {
      folder = this->Makefile->GetState()->GetGlobalProperty(
        "AUTOGEN_TARGETS_FOLDER");
    }
    // Inherit FOLDER property from target (#13688)
    if (!folder) {
      folder = this->GenTarget->GetProperty("FOLDER");
    }
    if (folder) {
      this->TargetsFolder = *folder;
    }
  }

  // Check status of policy CMP0071 regarding handling of GENERATED files
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0071)) {
    case cmPolicies::WARN:
      // Ignore GENERATED files but warn
      this->CMP0071Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore GENERATED files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process GENERATED files
      this->CMP0071Accept = true;
      break;
  }

  // Check status of policy CMP0100 regarding handling of .hh headers
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0100)) {
    case cmPolicies::WARN:
      // Ignore but .hh files but warn
      this->CMP0100Warn = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // Ignore .hh files
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Process .hh file
      this->CMP0100Accept = true;
      break;
  }

  // Common directories
  std::string relativeBuildDir;
  {
    // Collapsed current binary directory
    std::string const cbd = cmSystemTools::CollapseFullPath(
      std::string(), this->Makefile->GetCurrentBinaryDirectory());

    // Info directory
    this->Dir.Info = cmStrCat(cbd, "/CMakeFiles/", this->GenTarget->GetName(),
                              "_autogen.dir");
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Info);

    // Build directory
    this->Dir.Build = this->GenTarget->GetSafeProperty("AUTOGEN_BUILD_DIR");
    if (this->Dir.Build.empty()) {
      this->Dir.Build =
        cmStrCat(cbd, '/', this->GenTarget->GetName(), "_autogen");
    }
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Build);
    this->Dir.RelativeBuild =
      cmSystemTools::RelativePath(cbd, this->Dir.Build);
    // Cleanup build directory
    this->AddCleanFile(this->Dir.Build);

    // Working directory
    this->Dir.Work = cbd;
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Work);

    // Include directory
    this->ConfigFileNamesAndGenex(this->Dir.Include, this->Dir.IncludeGenExp,
                                  cmStrCat(this->Dir.Build, "/include"), "");
  }

  // Moc, Uic and _autogen target settings
  if (this->MocOrUicEnabled()) {
    // Init moc specific settings
    if (this->Moc.Enabled && !this->InitMoc()) {
      return false;
    }

    // Init uic specific settings
    if (this->Uic.Enabled && !this->InitUic()) {
      return false;
    }

    // Autogen target name
    this->AutogenTarget.Name =
      cmStrCat(this->GenTarget->GetName(), "_autogen");

    // Autogen target parallel processing
    {
      std::string const& prop =
        this->GenTarget->GetSafeProperty("AUTOGEN_PARALLEL");
      if (prop.empty() || (prop == "AUTO")) {
        // Autodetect number of CPUs
        this->AutogenTarget.Parallel = GetParallelCPUCount();
      } else {
        this->AutogenTarget.Parallel = 1;
      }
    }

    // Autogen target info and settings files
    {
      // Info file
      this->AutogenTarget.InfoFile =
        cmStrCat(this->Dir.Info, "/AutogenInfo.json");

      // Used settings file
      this->ConfigFileNames(this->AutogenTarget.SettingsFile,
                            cmStrCat(this->Dir.Info, "/AutogenUsed"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.SettingsFile);

      // Parse cache file
      this->ConfigFileNames(this->AutogenTarget.ParseCacheFile,
                            cmStrCat(this->Dir.Info, "/ParseCache"), ".txt");
      this->ConfigFileClean(this->AutogenTarget.ParseCacheFile);
    }

    // Autogen target: Compute user defined dependencies
    {
      this->AutogenTarget.DependOrigin =
        this->GenTarget->GetPropertyAsBool("AUTOGEN_ORIGIN_DEPENDS");

      std::string const& deps =
        this->GenTarget->GetSafeProperty("AUTOGEN_TARGET_DEPENDS");
      if (!deps.empty()) {
        for (std::string const& depName : cmExpandedList(deps)) {
          // Allow target and file dependencies
          auto* depTarget = this->Makefile->FindTargetToUse(depName);
          if (depTarget) {
            this->AutogenTarget.DependTargets.insert(depTarget);
          } else {
            this->AutogenTarget.DependFiles.insert(depName);
          }
        }
      }
    }

    if (this->Moc.Enabled) {
      // Path prefix
      if (cmIsOn(this->GenTarget->GetProperty("AUTOMOC_PATH_PREFIX"))) {
        this->Moc.PathPrefix = true;
      }

      // CMAKE_AUTOMOC_RELAXED_MODE
      if (this->Makefile->IsOn("CMAKE_AUTOMOC_RELAXED_MODE")) {
        this->Moc.RelaxedMode = true;
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat("AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is "
                   "deprecated an will be removed in the future.  Consider "
                   "disabling it and converting the target ",
                   this->GenTarget->GetName(), " to regular mode."));
      }

      // Options
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MOC_OPTIONS"),
                   this->Moc.Options);
      // Filters
      cmExpandList(this->GenTarget->GetSafeProperty("AUTOMOC_MACRO_NAMES"),
                   this->Moc.MacroNames);
      this->Moc.MacroNames.erase(cmRemoveDuplicates(this->Moc.MacroNames),
                                 this->Moc.MacroNames.end());
      {
        auto filterList = cmExpandedList(
          this->GenTarget->GetSafeProperty("AUTOMOC_DEPEND_FILTERS"));
        if ((filterList.size() % 2) != 0) {
          cmSystemTools::Error(
            cmStrCat("AutoMoc: AUTOMOC_DEPEND_FILTERS predefs size ",
                     filterList.size(), " is not a multiple of 2."));
          return false;
        }
        this->Moc.DependFilters.reserve(1 + (filterList.size() / 2));
        this->Moc.DependFilters.emplace_back(
          "Q_PLUGIN_METADATA",
          "[\n][ \t]*Q_PLUGIN_METADATA[ \t]*\\("
          "[^\\)]*FILE[ \t]*\"([^\"]+)\"");
        for (std::size_t ii = 0; ii != filterList.size(); ii += 2) {
          this->Moc.DependFilters.emplace_back(filterList[ii],
                                               filterList[ii + 1]);
        }
      }
    }
  }

  // Init rcc specific settings
  if (this->Rcc.Enabled && !this->InitRcc()) {
    return false;
  }

  // Add autogen include directory to the origin target INCLUDE_DIRECTORIES
  if (this->MocOrUicEnabled() || (this->Rcc.Enabled && this->MultiConfig)) {
    this->GenTarget->AddIncludeDirectory(this->Dir.IncludeGenExp, true);
  }

  // Scan files
  if (!this->InitScanFiles()) {
    return false;
  }

  // Create autogen target
  if (this->MocOrUicEnabled() && !this->InitAutogenTarget()) {
    return false;
  }

  // Create rcc targets
  if (this->Rcc.Enabled && !this->InitRccTargets()) {
    return false;
  }

  return true;
}